

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int createModule(sqlite3 *db,char *zName,sqlite3_module *pModule,void *pAux,
                _func_void_void_ptr *xDestroy)

{
  int iVar1;
  void *pvVar2;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  pvVar2 = sqlite3HashFind(&db->aModule,zName);
  if (pvVar2 == (void *)0x0) {
    sqlite3VtabCreateModule(db,zName,pModule,pAux,xDestroy);
    iVar1 = 0;
  }
  else {
    iVar1 = sqlite3MisuseError(0x209fe);
  }
  iVar1 = sqlite3ApiExit(db,iVar1);
  if (xDestroy != (_func_void_void_ptr *)0x0 && iVar1 != 0) {
    (*xDestroy)(pAux);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar1;
}

Assistant:

static int createModule(
  sqlite3 *db,                    /* Database in which module is registered */
  const char *zName,              /* Name assigned to this module */
  const sqlite3_module *pModule,  /* The definition of the module */
  void *pAux,                     /* Context pointer for xCreate/xConnect */
  void (*xDestroy)(void *)        /* Module destructor function */
){
  int rc = SQLITE_OK;

  sqlite3_mutex_enter(db->mutex);
  if( sqlite3HashFind(&db->aModule, zName) ){
    rc = SQLITE_MISUSE_BKPT;
  }else{
    (void)sqlite3VtabCreateModule(db, zName, pModule, pAux, xDestroy);
  }
  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && xDestroy ) xDestroy(pAux);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}